

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O0

ProblemType Clasp::detectProblemType(istream *in)

{
  char cVar1;
  int iVar2;
  int_type iVar3;
  uint uVar4;
  socklen_t *__addr_len;
  socklen_t *__addr_len_00;
  socklen_t *__addr_len_01;
  sockaddr *in_RSI;
  char c;
  int_type pos;
  int_type line;
  int_type x;
  int local_1c;
  uint local_18;
  
  local_18 = 1;
  local_1c = 1;
  while( true ) {
    while( true ) {
      iVar2 = std::istream::peek();
      iVar3 = std::char_traits<char>::eof();
      if (iVar2 == iVar3) {
        Potassco::fail(-2,"ProblemType Clasp::detectProblemType(std::istream &)",0x38,"false",
                       "bad input stream",0);
      }
      cVar1 = (char)iVar2;
      if ((cVar1 != ' ') && (cVar1 != '\t')) break;
      std::istream::get();
      local_1c = local_1c + 1;
    }
    uVar4 = AspParser::accept((int)cVar1,in_RSI,__addr_len);
    if ((uVar4 & 1) != 0) {
      return Asp;
    }
    uVar4 = DimacsReader::accept((int)cVar1,in_RSI,__addr_len_00);
    if ((uVar4 & 1) != 0) {
      return Sat;
    }
    uVar4 = OpbReader::accept((int)cVar1,in_RSI,__addr_len_01);
    if ((uVar4 & 1) != 0) break;
    if (cVar1 != '\n') {
      Potassco::fail(-2,"ProblemType Clasp::detectProblemType(std::istream &)",0x34,"c == \'\\n\'",
                     "parse error in line %d:%d: \'%c\': unrecognized input format",(ulong)local_18,
                     local_1c,(int)cVar1,0);
    }
    std::istream::get();
    local_18 = local_18 + 1;
  }
  return Pb;
}

Assistant:

ProblemType detectProblemType(std::istream& in) {
	for (std::istream::int_type x, line = 1, pos = 1; (x = in.peek()) != std::char_traits<char>::eof();) {
		char c = static_cast<char>(x);
		if (c == ' ' || c == '\t')  { in.get(); ++pos; continue; }
		if (AspParser::accept(c))   { return Problem_t::Asp; }
		if (DimacsReader::accept(c)){ return Problem_t::Sat; }
		if (OpbReader::accept(c))   { return Problem_t::Pb;  }
		POTASSCO_REQUIRE(c == '\n', "parse error in line %d:%d: '%c': unrecognized input format", (int)line,(int)pos, c);
		in.get();
		++line;
	}
	POTASSCO_REQUIRE(false, "bad input stream");
}